

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherCWrapper.cpp
# Opt level: O0

efsw_watchid
efsw_addwatch_withoptions
          (efsw_watcher watcher,char *directory,efsw_pfn_fileaction_callback callback_fn,
          int recursive,efsw_watcher_option *options,int options_number,void *param)

{
  efsw_pfn_fileaction_callback p_Var1;
  char *this;
  Watcher_CAPI *this_00;
  WatchID WVar2;
  allocator local_a1;
  string local_a0 [32];
  WatcherOption local_80;
  efsw_watcher_option *local_78;
  efsw_watcher_option *option;
  undefined1 local_68 [4];
  int i;
  vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> watcher_options;
  Watcher_CAPI *local_40;
  Watcher_CAPI *callback;
  efsw_watcher_option *peStack_30;
  int options_number_local;
  efsw_watcher_option *options_local;
  efsw_pfn_fileaction_callback p_Stack_20;
  int recursive_local;
  efsw_pfn_fileaction_callback callback_fn_local;
  char *directory_local;
  efsw_watcher watcher_local;
  
  callback._4_4_ = options_number;
  peStack_30 = options;
  options_local._4_4_ = recursive;
  p_Stack_20 = callback_fn;
  callback_fn_local = (efsw_pfn_fileaction_callback)directory;
  directory_local = (char *)watcher;
  local_40 = find_callback(watcher,callback_fn,param);
  if (local_40 == (Watcher_CAPI *)0x0) {
    this_00 = (Watcher_CAPI *)operator_new(0x20);
    Watcher_CAPI::Watcher_CAPI(this_00,directory_local,p_Stack_20,param);
    local_40 = this_00;
    std::vector<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>::push_back(&g_callbacks,&local_40);
  }
  memset(local_68,0,0x18);
  std::vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>::vector
            ((vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *)local_68);
  for (option._4_4_ = 0; this = directory_local, p_Var1 = callback_fn_local,
      option._4_4_ < callback._4_4_; option._4_4_ = option._4_4_ + 1) {
    local_78 = peStack_30 + option._4_4_;
    efsw::WatcherOption::WatcherOption(&local_80,local_78->option,local_78->value);
    std::vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>::
    emplace_back<efsw::WatcherOption>
              ((vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *)local_68,
               &local_80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,(char *)p_Var1,&local_a1);
  WVar2 = efsw::FileWatcher::addWatch
                    ((FileWatcher *)this,(string *)local_a0,&local_40->super_FileWatchListener,
                     options_local._4_4_ != 0,
                     (vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *)local_68);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>::~vector
            ((vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *)local_68);
  return WVar2;
}

Assistant:

efsw_watchid  efsw_addwatch_withoptions(efsw_watcher watcher, const char* directory,
										efsw_pfn_fileaction_callback callback_fn, int recursive,
										efsw_watcher_option *options, int options_number,
										void* param) {
	Watcher_CAPI* callback = find_callback( watcher, callback_fn, param );

	if ( callback == NULL ) {
		callback = new Watcher_CAPI( watcher, callback_fn, param );
		g_callbacks.push_back( callback );
	}

	std::vector<efsw::WatcherOption> watcher_options{};
	for ( int i = 0; i < options_number; i++ ) {
		efsw_watcher_option* option = &options[i];
		watcher_options.emplace_back( efsw::WatcherOption{
			static_cast<efsw::Option>(option->option), option->value } );
	}

	return ( (efsw::FileWatcher*)watcher )
		->addWatch( std::string( directory ), callback, TOBOOL( recursive ), watcher_options );
}